

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::
StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
::WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  ValidityMask *mask;
  undefined1 uVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  idx_t i;
  Allocator *pAVar4;
  long lVar5;
  idx_t iVar6;
  primitive_dictionary_entry_t *ppVar7;
  InternalException *this_00;
  uint *puVar8;
  _func_int **extraout_RDX;
  _func_int **extraout_RDX_00;
  _func_int **pp_Var9;
  _func_int **extraout_RDX_01;
  _func_int **extraout_RDX_02;
  _func_int **extraout_RDX_03;
  _func_int **extraout_RDX_04;
  idx_t r;
  idx_t iVar10;
  WriteStream *ser;
  hugeint_t *value;
  uint64_t *puVar11;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  ParquetUUIDTargetType target_value_00;
  ParquetUUIDTargetType target_value_01;
  ParquetUUIDTargetType target_value_02;
  ParquetUUIDTargetType target_value_03;
  ParquetUUIDTargetType target_value_04;
  ParquetUUIDTargetType target_value;
  string local_50;
  
  ser = (WriteStream *)chunk_start;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01bfad5b_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  mask = &input_column->validity;
  pdVar2 = input_column->data;
  puVar8 = &switchD_01bfad5b::switchdataD_01e6e300;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
              (input_column,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_01bfad5b_caseD_1;
  case 5:
    pp_Var9 = extraout_RDX;
    iVar10 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar8 = (uint *)(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar10 = chunk_start;
        if (((unsigned_long *)puVar8 == (unsigned_long *)0x0) ||
           (pp_Var9 = *(_func_int ***)((long)puVar8 + (iVar6 >> 6) * 8), iVar10 = iVar6,
           ((ulong)pp_Var9 >> (iVar6 & 0x3f) & 1) != 0)) {
          input_02.upper = (int64_t)pp_Var9;
          input_02.lower = *(uint64_t *)(pdVar2 + iVar10 * 0x10 + 8);
          local_50._0_16_ =
               ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                         (*(ParquetUUIDOperator **)(pdVar2 + iVar10 * 0x10),input_02);
          target_value_03.bytes._0_8_ = local_50._M_string_length;
          target_value_03.bytes._8_8_ = puVar8;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,local_50._M_dataplus._M_p,target_value_03);
          DbpEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(ParquetUUIDTargetType *)&local_50
                    );
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          iVar10 = iVar10 + 1;
          pp_Var9 = extraout_RDX_03;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar10 = chunk_end;
      } while (chunk_end != iVar6);
    }
    lVar5 = chunk_end - iVar10;
    if (iVar10 <= chunk_end && lVar5 != 0) {
      puVar11 = (uint64_t *)(pdVar2 + iVar10 * 0x10 + 8);
      do {
        input_03.upper = (int64_t)pp_Var9;
        input_03.lower = *puVar11;
        local_50._0_16_ =
             ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                       ((ParquetUUIDOperator *)puVar11[-1],input_03);
        target_value_04.bytes._0_8_ = local_50._M_string_length;
        target_value_04.bytes._8_8_ = puVar8;
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)stats,local_50._M_dataplus._M_p,target_value_04);
        DbpEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                  ((DbpEncoder *)(page_state_p + 2),temp_writer,(ParquetUUIDTargetType *)&local_50);
        puVar11 = puVar11 + 2;
        lVar5 = lVar5 + -1;
        pp_Var9 = extraout_RDX_04;
      } while (lVar5 != 0);
    }
    break;
  case 6:
    pp_Var9 = extraout_RDX;
    iVar10 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar8 = (uint *)(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar10 = chunk_start;
        if (((string *)puVar8 == (string *)0x0) ||
           (pp_Var9 = (_func_int **)(&((string *)puVar8)->_M_dataplus)[iVar6 >> 6]._M_p,
           iVar10 = iVar6, ((ulong)pp_Var9 >> (iVar6 & 0x3f) & 1) != 0)) {
          input_00.upper = (int64_t)pp_Var9;
          input_00.lower = *(uint64_t *)(pdVar2 + iVar10 * 0x10 + 8);
          local_50._0_16_ =
               ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                         (*(ParquetUUIDOperator **)(pdVar2 + iVar10 * 0x10),input_00);
          target_value_01.bytes._0_8_ = local_50._M_string_length;
          target_value_01.bytes._8_8_ = &local_50;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,local_50._M_dataplus._M_p,target_value_01);
          pAVar4 = BufferAllocator::Get
                             (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          puVar8 = (uint *)&local_50;
          DlbaEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar4,temp_writer,
                     (ParquetUUIDTargetType *)puVar8);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          iVar10 = iVar10 + 1;
          pp_Var9 = extraout_RDX_01;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar10 = chunk_end;
      } while (chunk_end != iVar6);
    }
    lVar5 = chunk_end - iVar10;
    if (iVar10 <= chunk_end && lVar5 != 0) {
      puVar11 = (uint64_t *)(pdVar2 + iVar10 * 0x10 + 8);
      do {
        input_01.upper = (int64_t)pp_Var9;
        input_01.lower = *puVar11;
        local_50._0_16_ =
             ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                       ((ParquetUUIDOperator *)puVar11[-1],input_01);
        target_value_02.bytes._0_8_ = local_50._M_string_length;
        target_value_02.bytes._8_8_ = puVar8;
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)stats,local_50._M_dataplus._M_p,target_value_02);
        DlbaEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                  ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,
                   (ParquetUUIDTargetType *)&local_50);
        puVar11 = puVar11 + 2;
        lVar5 = lVar5 + -1;
        pp_Var9 = extraout_RDX_02;
      } while (lVar5 != 0);
    }
    break;
  case 8:
    iVar10 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar10 = chunk_start;
        if ((puVar3 == (unsigned_long *)0x0) ||
           (iVar10 = iVar6, (puVar3[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) {
          local_50._M_dataplus._M_p._0_1_ =
               *(data_t *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_50,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar10 = chunk_end;
      } while (chunk_end != iVar6);
    }
    lVar5 = chunk_end - iVar10;
    if (iVar10 <= chunk_end && lVar5 != 0) {
      value = (hugeint_t *)(pdVar2 + iVar10 * 0x10);
      do {
        ppVar7 = PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                 ::Lookup((PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                           *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
        local_50._M_dataplus._M_p._0_4_ = ppVar7->index;
        RleBpEncoder::WriteValue
                  ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_50);
        value = value + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    break;
  case 9:
    pp_Var9 = extraout_RDX;
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar4 = BufferAllocator::Get
                         (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar4);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      pp_Var9 = extraout_RDX_00;
    }
    if (chunk_start < chunk_end) {
      do {
        input.upper = (int64_t)pp_Var9;
        input.lower = *(uint64_t *)(pdVar2 + chunk_start * 0x10 + 8);
        local_50._0_16_ =
             ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                       (*(ParquetUUIDOperator **)(pdVar2 + chunk_start * 0x10),input);
        target_value_00.bytes._0_8_ = local_50._M_string_length;
        target_value_00.bytes._8_8_ = puVar8;
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)stats,local_50._M_dataplus._M_p,target_value_00);
        lVar5 = 0;
        do {
          uVar1 = *(undefined1 *)((long)&local_50._M_dataplus._M_p + lVar5);
          puVar8 = (uint *)CONCAT71((int7)((ulong)puVar8 >> 8),uVar1);
          pp_Var9 = (_func_int **)
                    ((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar5 +
                    (long)page_state_p[0x1219]._vptr_ColumnWriterPageState);
          *(undefined1 *)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + (long)pp_Var9) =
               uVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}